

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O1

void __thiscall
Voxelizer::count_and_create_fragment_list
          (Voxelizer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  Counter *this_00;
  VkDeviceSize VVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  DescriptorSet *this_02;
  source_loc loc;
  enable_shared_from_this<myvk::Base> *peVar3;
  undefined8 uVar4;
  element_type *peVar5;
  int iVar6;
  uint32_t uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  logger *this_03;
  long lVar8;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  undefined8 uStack_b0;
  undefined1 local_a8 [48];
  undefined1 local_78 [24];
  element_type *peStack_60;
  Ptr<PipelineBase> local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  this_00 = &this->m_atomic_counter;
  Counter::Reset(this_00,command_pool,0);
  myvk::CommandBuffer::Create
            ((CommandBuffer *)local_78,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin((CommandBuffer *)local_78._0_8_,1);
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  myvk::CommandBuffer::CmdBeginRenderPass
            ((CommandBuffer *)local_78._0_8_,&this->m_render_pass,&this->m_framebuffer,
             (vector<VkClearValue,_std::allocator<VkClearValue>_> *)local_a8,
             VK_SUBPASS_CONTENTS_INLINE);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
  }
  local_a8._0_8_ =
       (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_a8._8_8_ =
       (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
    }
  }
  myvk::CommandBuffer::CmdBindPipeline
            ((CommandBuffer *)local_78._0_8_,(Ptr<PipelineBase> *)local_a8);
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  uVar4 = local_78._0_8_;
  local_a8._0_8_ =
       (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_a8._8_8_ =
       (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
    }
  }
  peVar2 = (this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8._16_8_ =
       (peVar2->m_descriptor_set).
       super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8._24_8_ =
       (peVar2->m_descriptor_set).
       super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((element_type *)local_a8._24_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar3 = &(((element_type *)local_a8._24_8_)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar3->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar3->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar3 = &(((element_type *)local_a8._24_8_)->super_Base).
                super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar3->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar3->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)local_a8;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)(local_78 + 0x10),__l,(allocator_type *)(local_a8 + 0x2f));
  local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_PipelineBase;
  local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets
            ((CommandBuffer *)uVar4,
             (vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)(local_78 + 0x10),&local_48,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)(local_78 + 0x10));
  lVar8 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_b0 + lVar8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_b0 + lVar8));
    }
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != 0);
  local_a8._0_4_ = 1;
  myvk::CommandBuffer::CmdPushConstants
            ((CommandBuffer *)local_78._0_8_,&this->m_pipeline_layout,0x10,0,4,local_a8);
  Scene::CmdDraw((this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (shared_ptr<myvk::CommandBuffer> *)local_78,&this->m_pipeline_layout,4);
  myvk::CommandBuffer::CmdEndRenderPass((CommandBuffer *)local_78._0_8_);
  myvk::CommandBuffer::End((CommandBuffer *)local_78._0_8_);
  iVar6 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  myvk::Fence::Create((Fence *)local_a8,(Ptr<Device> *)CONCAT44(extraout_var,iVar6),0);
  myvk::CommandBuffer::Submit((CommandBuffer *)local_78._0_8_,(Ptr<Fence> *)local_a8);
  myvk::Fence::Wait((Fence *)local_a8._0_8_,0xffffffffffffffff);
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  uVar7 = Counter::Read(this_00,command_pool);
  this->m_voxel_fragment_count = uVar7;
  Counter::Reset(this_00,command_pool,0);
  iVar6 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)(local_78 + 0x10),(Ptr<Device> *)CONCAT44(extraout_var_00,iVar6),
             (ulong)this->m_voxel_fragment_count << 3,0,0x20,VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_a8);
  peVar5 = peStack_60;
  uVar4 = local_78._16_8_;
  local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_60 = (element_type *)0x0;
  this_01 = (this->m_voxel_fragment_list).
            super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar4;
  (this->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (peStack_60 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60);
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_a8);
  this_02 = (this->m_descriptor_set).
            super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8._0_8_ =
       (this->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_a8._8_8_ =
       (this->m_voxel_fragment_list).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer
            (this_02,(Ptr<BufferBase> *)local_a8,1,0,0,0xffffffffffffffff);
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  VVar1 = (((this->m_voxel_fragment_list).
            super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BufferBase).
          m_size;
  local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((((double)CONCAT44(0x45300000,(int)(VVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0)) / 1000000.0);
  this_03 = spdlog::default_logger_raw();
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_78._16_8_ = "Voxel fragment list created with {} voxels ({} MB)";
  peStack_60 = (element_type *)0x32;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,unsigned_int&,double>
            (this_03,loc,info,(basic_string_view<char> *)(local_78 + 0x10),
             &this->m_voxel_fragment_count,(double *)&local_38);
  return;
}

Assistant:

void Voxelizer::count_and_create_fragment_list(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	{
		m_atomic_counter.Reset(command_pool, 0);
		std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
		command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
		command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffer, {});
		{
			command_buffer->CmdBindPipeline(m_pipeline);
			command_buffer->CmdBindDescriptorSets({m_descriptor_set, m_scene_ptr->GetDescriptorSet()}, m_pipeline, {});
			uint32_t push_constants[] = {1};
			command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t),
			                                 push_constants);
			m_scene_ptr->CmdDraw(command_buffer, m_pipeline_layout, sizeof(uint32_t));
		}
		command_buffer->CmdEndRenderPass();
		command_buffer->End();
		std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
		command_buffer->Submit(fence);
		fence->Wait();
	}

	m_voxel_fragment_count = m_atomic_counter.Read(command_pool);
	m_atomic_counter.Reset(command_pool, 0);

	m_voxel_fragment_list =
	    myvk::Buffer::Create(command_pool->GetDevicePtr(), m_voxel_fragment_count * sizeof(uint32_t) * 2, 0,
	                         VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	m_descriptor_set->UpdateStorageBuffer(m_voxel_fragment_list, 1);

	spdlog::info("Voxel fragment list created with {} voxels ({} MB)", m_voxel_fragment_count,
	             m_voxel_fragment_list->GetSize() / 1000000.0);
}